

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforceModuleInstantiationPrefix.cpp
# Opt level: O2

void __thiscall
enforce_module_instantiation_prefix::MainVisitor::handle(MainVisitor *this,InstanceSymbol *instance)

{
  TidyConfig *pTVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  iterator iVar5;
  Diagnostic *pDVar6;
  Symbol *member;
  string_view sVar7;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar8;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  sVar7 = slang::SourceManager::getFileName
                    ((this->super_TidyVisitor).sourceManager.ptr,
                     (instance->super_InstanceSymbolBase).super_Symbol.location);
  bVar4 = TidyVisitor::skip(&this->super_TidyVisitor,sVar7);
  if (!bVar4) {
    bVar4 = slang::ast::InstanceSymbol::isModule(instance);
    if (bVar4) {
      pTVar1 = (this->super_TidyVisitor).config;
      pcVar2 = (pTVar1->checkConfigs).moduleInstantiationPrefix._M_dataplus._M_p;
      sVar3 = (pTVar1->checkConfigs).moduleInstantiationPrefix._M_string_length;
      sVar8 = slang::ast::Scope::members(&instance->body->super_Scope);
      for (iVar5 = sVar8._M_begin.current; iVar5.current != sVar8._M_end.current.current;
          iVar5.current = (iVar5.current)->nextInScope) {
        if ((iVar5.current)->kind == Instance) {
          __x._M_str = pcVar2;
          __x._M_len = sVar3;
          bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            (&(iVar5.current)->name,__x);
          if (!bVar4) {
            pDVar6 = slang::Diagnostics::add
                               ((this->super_TidyVisitor).diags,(DiagCode)0x20010,
                                (iVar5.current)->location);
            pDVar6 = slang::Diagnostic::operator<<(pDVar6,(iVar5.current)->name);
            sVar7._M_str = pcVar2;
            sVar7._M_len = sVar3;
            slang::Diagnostic::operator<<(pDVar6,sVar7);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& instance) {
        NEEDS_SKIP_SYMBOL(instance)

        if (!instance.isModule())
            return;

        std::string_view prefix = config.getCheckConfigs().moduleInstantiationPrefix;
        for (auto& member : instance.body.members()) {
            if (member.kind == SymbolKind::Instance && !member.name.starts_with(prefix)) {
                diags.add(diag::EnforcePortSuffix, member.location) << member.name << prefix;
            }
        }
    }